

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

bool soul::shouldShow(Function *f)

{
  bool bVar1;
  Comment local_50;
  
  getComment(&local_50,&(f->super_ASTObject).context);
  bVar1 = local_50.range.start.sourceCode.object != (SourceCodeText *)0x0;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.range.end.sourceCode.object);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.range.start.sourceCode.object);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50.lines);
  return local_50.isDoxygenStyle != false ||
         local_50.range.start.location.data != local_50.range.end.location.data && bVar1;
}

Assistant:

static bool shouldShow (const AST::Function& f)
{
    return shouldIncludeComment (getComment (f.context));
}